

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatabuffer_p.h
# Opt level: O1

void __thiscall QDataBuffer<QPathVertex>::reserve(QDataBuffer<QPathVertex> *this,qsizetype size)

{
  if (size <= this->capacity) {
    return;
  }
  reserve();
  return;
}

Assistant:

void reserve(qsizetype size) {
        if (size > capacity) {
            if (capacity == 0)
                capacity = 1;
            while (capacity < size)
                capacity *= 2;
            buffer = (Type*) QtPrivate::fittedRealloc(static_cast<void*>(buffer), 0, &capacity, sizeof(Type));
            Q_CHECK_PTR(buffer);
        }
    }